

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QStringList *
getQtLibsFromElf(QStringList *__return_storage_ptr__,Options *options,QString *fileName)

{
  byte bVar1;
  long lVar2;
  Span *pSVar3;
  Entry *pEVar4;
  FILE *pFVar5;
  UP __stream;
  Data *pDVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  Data *pDVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  char *pcVar13;
  size_t size;
  qsizetype qVar14;
  ulong uVar15;
  QString *pQVar16;
  undefined8 *puVar17;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QAnyStringView QVar18;
  const_iterator cVar19;
  UP readElfCommand;
  QArrayDataPointer<char16_t> local_2f0;
  QArrayDataPointer<char16_t> local_2d8;
  QArrayDataPointer<char16_t> local_2b8;
  QArrayDataPointer<char16_t> local_298;
  QArrayDataPointer<char> local_278;
  QArrayDataPointer<QString> local_258;
  char buffer [512];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_298.size = 0xaaaaaaaaaaaaaaaa;
  local_298.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_298.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  llvmReadobjPath((QString *)&local_298,options);
  cVar10 = QFile::exists((QString *)&local_298);
  pFVar5 = _stderr;
  if (cVar10 == '\0') {
    QString::toLocal8Bit((QByteArray *)buffer,(QString *)&local_298);
    puVar17 = (undefined8 *)buffer._8_8_;
    if (buffer._8_8_ == 0) {
      puVar17 = &QByteArray::_empty;
    }
    fprintf(pFVar5,"Command does not exist: %s\n",puVar17);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    shellQuote((QString *)&local_2d8,(QString *)&local_298);
    shellQuote((QString *)&local_2f0,fileName);
    local_258.size = local_2d8.size | 0x8000000000000000;
    buffer._0_8_ = &local_258;
    local_258.d = (Data *)CONCAT71(local_258.d._1_7_,1);
    local_258.ptr = (QString *)local_2d8.ptr;
    local_278.size = local_2f0.size | 0x8000000000000000;
    buffer._8_8_ = &local_278;
    local_278.d = (Data *)CONCAT71(local_278.d._1_7_,1);
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    local_278.ptr = (char *)local_2f0.ptr;
    QVar18.m_size = (size_t)"%1 --needed-libs %2";
    QVar18.field_0.m_data = &local_2b8;
    QtPrivate::argToQString(QVar18,0x4000000000000013,(ArgBase **)0x2);
    qVar14 = local_298.size;
    pcVar7 = local_298.ptr;
    pDVar6 = local_298.d;
    local_298.d = local_2b8.d;
    local_298.ptr = local_2b8.ptr;
    local_2b8.d = pDVar6;
    local_2b8.ptr = pcVar7;
    local_298.size = local_2b8.size;
    local_2b8.size = qVar14;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
    readElfCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl
         = (__uniq_ptr_data<_IO_FILE,_Closer,_true,_true>)
           (__uniq_ptr_impl<_IO_FILE,_Closer>)0xaaaaaaaaaaaaaaaa;
    openProcess((QString *)&readElfCommand);
    __stream = readElfCommand;
    pFVar5 = _stderr;
    if ((__uniq_ptr_impl<_IO_FILE,_Closer>)
        readElfCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>.
        _M_head_impl == (__uniq_ptr_impl<_IO_FILE,_Closer>)0x0) {
      QString::toLocal8Bit((QByteArray *)buffer,(QString *)&local_298);
      puVar17 = (undefined8 *)buffer._8_8_;
      if (buffer._8_8_ == 0) {
        puVar17 = &QByteArray::_empty;
      }
      fprintf(pFVar5,"Cannot execute command %s\n",puVar17);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      local_258.d = (Data *)0x0;
      local_258.ptr = (QString *)0x0;
      local_258.size = 0;
      memset(buffer,0xaa,0x200);
      bVar12 = false;
      while( true ) {
        pcVar13 = fgets(buffer,0x200,
                        (FILE *)__stream._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
                                super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.
                                super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
        qVar14 = local_258.size;
        pQVar16 = local_258.ptr;
        pDVar9 = local_258.d;
        if (pcVar13 == (char *)0x0) break;
        local_278.size = 0xaaaaaaaaaaaaaaaa;
        local_278.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_278.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        size = strlen(buffer);
        QByteArray::fromRawData((QByteArray *)&local_278,buffer,size);
        local_2b8.d = (Data *)0x0;
        local_2b8.ptr = (char16_t *)0x0;
        local_2b8.size = 0;
        QByteArray::trimmed_helper((QByteArray *)&local_2d8);
        qVar14 = local_278.size;
        pcVar13 = local_278.ptr;
        pDVar8 = local_278.d;
        local_278.d = (Data *)local_2d8.d;
        local_278.ptr = (char *)local_2d8.ptr;
        local_2d8.d = (Data *)pDVar8;
        local_2d8.ptr = (char16_t *)pcVar13;
        local_278.size = local_2d8.size;
        local_2d8.size = qVar14;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_2d8);
        if (bVar12 == false) {
          qVar14 = QByteArrayView::lengthHelperCharArray("Arch: ",7);
          bv_00.m_data = "Arch: ";
          bv_00.m_size = qVar14;
          bVar12 = QByteArray::startsWith((QByteArray *)&local_278,bv_00);
          if (bVar12) {
            QByteArray::mid((longlong)&local_2d8,(longlong)&local_278);
            cVar19 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                               (&elfArchitectures,(QByteArray *)&local_2d8);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_2d8);
            if (cVar19.i.d != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 ||
                cVar19.i.bucket != 0) {
              pSVar3 = (cVar19.i.d)->spans;
              uVar15 = cVar19.i.bucket >> 7;
              pEVar4 = pSVar3[uVar15].entries;
              bVar1 = pSVar3[uVar15].offsets[(uint)cVar19.i.bucket & 0x7f];
              QString::toLatin1_helper((QString *)&local_2d8);
              bVar12 = operator!=((QByteArray *)(pEVar4[bVar1].storage.data + 0x18),
                                  (QByteArray *)&local_2d8);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_2d8);
              if (!bVar12) goto LAB_00116b65;
            }
            pFVar5 = _stdout;
            if (options->verbose == true) {
              QString::toLocal8Bit((QByteArray *)&local_2d8,fileName);
              pQVar16 = (QString *)local_2d8.ptr;
              if ((QString *)local_2d8.ptr == (QString *)0x0) {
                pQVar16 = (QString *)&QByteArray::_empty;
              }
              fprintf(pFVar5,"Skipping \"%s\", architecture mismatch\n",pQVar16);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_2d8);
            }
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (QString *)0x0;
            (__return_storage_ptr__->d).size = 0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_278);
            goto LAB_00116c57;
          }
LAB_00116b65:
          qVar14 = QByteArrayView::lengthHelperCharArray("NeededLibraries",0x10);
          bv_01.m_data = "NeededLibraries";
          bv_01.m_size = qVar14;
          bVar12 = QByteArray::startsWith((QByteArray *)&local_278,bv_01);
        }
        else {
          qVar14 = QByteArrayView::lengthHelperCharArray("lib",4);
          bv.m_data = "lib";
          bv.m_size = qVar14;
          bVar11 = QByteArray::startsWith((QByteArray *)&local_278,bv);
          bVar12 = true;
          if (bVar11) {
            QString::fromLatin1<void>((QString *)&local_2d8,(QByteArray *)&local_278);
            qVar14 = local_2b8.size;
            pcVar7 = local_2b8.ptr;
            pDVar6 = local_2b8.d;
            local_2b8.d = local_2d8.d;
            local_2b8.ptr = local_2d8.ptr;
            local_2d8.d = pDVar6;
            local_2d8.ptr = pcVar7;
            local_2b8.size = local_2d8.size;
            local_2d8.size = qVar14;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
            local_2d8.size = 0xaaaaaaaaaaaaaaaa;
            local_2d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_2d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_2f0.d = (Data *)0x4;
            local_2f0.ptr = L"lib/";
            local_2f0.size = (qsizetype)&local_2b8;
            QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>
                      ((QString *)&local_2d8,(QStringBuilder<QLatin1String,_QString_&> *)&local_2f0)
            ;
            absoluteFilePath((QString *)&local_2f0,options,(QString *)&local_2d8);
            cVar10 = QFile::exists((QString *)&local_2f0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f0);
            if (cVar10 != '\0') {
              QList<QString>::emplaceBack<QString_const&>
                        ((QList<QString> *)&local_258,(QString *)&local_2d8);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
          }
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_278);
      }
      local_258.d = (Data *)0x0;
      local_258.ptr = (QString *)0x0;
      (__return_storage_ptr__->d).d = pDVar9;
      (__return_storage_ptr__->d).ptr = pQVar16;
      local_258.size = 0;
      (__return_storage_ptr__->d).size = qVar14;
LAB_00116c57:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_258);
    }
    std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr(&readElfCommand);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList getQtLibsFromElf(const Options &options, const QString &fileName)
{
    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return QStringList();
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(fileName));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return QStringList();
    }

    QStringList ret;

    bool readLibs = false;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        QString library;
        line = line.trimmed();
        if (!readLibs) {
            if (line.startsWith("Arch: ")) {
                auto it = elfArchitectures.find(line.mid(6));
                if (it == elfArchitectures.constEnd() || *it != options.currentArchitecture.toLatin1()) {
                    if (options.verbose)
                        fprintf(stdout, "Skipping \"%s\", architecture mismatch\n", qPrintable(fileName));
                    return {};
                }
            }
            readLibs = line.startsWith("NeededLibraries");
            continue;
        }
        if (!line.startsWith("lib"))
            continue;
        library = QString::fromLatin1(line);
        QString libraryName = "lib/"_L1 + library;
        if (QFile::exists(absoluteFilePath(&options, libraryName)))
            ret += libraryName;
    }

    return ret;
}